

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

int read_subject_to(string_view buf_1,string_view buf_2,string_view buf_3)

{
  bool bVar1;
  string_view rhs;
  string_view rhs_00;
  string_view rhs_01;
  string_view rhs_02;
  string_view rhs_03;
  string_view rhs_04;
  string_view rhs_05;
  string_view rhs_06;
  string_view rhs_07;
  string_view rhs_08;
  
  rhs._M_str = "st";
  rhs._M_len = 2;
  bVar1 = are_equal(buf_1,rhs);
  if ((((bVar1) ||
       (rhs_00._M_str = "st.", rhs_00._M_len = 3, bVar1 = are_equal(buf_1,rhs_00), bVar1)) ||
      (rhs_01._M_str = "s.t", rhs_01._M_len = 3, bVar1 = are_equal(buf_1,rhs_01), bVar1)) ||
     (rhs_02._M_str = "s.t.", rhs_02._M_len = 4, bVar1 = are_equal(buf_1,rhs_02), bVar1)) {
    rhs_03._M_str = ":";
    rhs_03._M_len = 1;
    bVar1 = are_equal(buf_2,rhs_03);
    return bVar1 + 1;
  }
  rhs_04._M_str = "subject";
  rhs_04._M_len = 7;
  bVar1 = are_equal(buf_1,rhs_04);
  if ((!bVar1) || (rhs_05._M_str = "to", rhs_05._M_len = 2, bVar1 = are_equal(buf_2,rhs_05), !bVar1)
     ) {
    rhs_06._M_str = "sush";
    rhs_06._M_len = 4;
    bVar1 = are_equal(buf_1,rhs_06);
    if (!bVar1) {
      return 0;
    }
    rhs_07._M_str = "that";
    rhs_07._M_len = 4;
    bVar1 = are_equal(buf_2,rhs_07);
    if (!bVar1) {
      return 0;
    }
  }
  rhs_08._M_str = ":";
  rhs_08._M_len = 1;
  bVar1 = are_equal(buf_3,rhs_08);
  return bVar1 | 2;
}

Assistant:

constexpr int
read_subject_to(const std::string_view buf_1,
                const std::string_view buf_2,
                const std::string_view buf_3) noexcept
{
    if (are_equal(buf_1, "st") || are_equal(buf_1, "st.") ||
        are_equal(buf_1, "s.t") || are_equal(buf_1, "s.t."))
        return are_equal(buf_2, ":") ? 2 : 1;

    if (are_equal(buf_1, "subject"))
        if (are_equal(buf_2, "to"))
            return are_equal(buf_3, ":") ? 3 : 2;

    if (are_equal(buf_1, "sush"))
        if (are_equal(buf_2, "that"))
            return are_equal(buf_3, ":") ? 3 : 2;

    return 0;
}